

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVisitor.cpp
# Opt level: O3

void __thiscall
llvm::DWARFYAML::VisitorImpl<llvm::DWARFYAML::Data>::onVariableSizeValue
          (VisitorImpl<llvm::DWARFYAML::Data> *this,uint64_t U,uint Size)

{
  switch(Size) {
  case 1:
    (*this->_vptr_VisitorImpl[10])(this,U & 0xff);
    return;
  case 2:
    (*this->_vptr_VisitorImpl[0xb])(this,U & 0xffff);
    return;
  default:
    llvm_unreachable_internal
              ("Invalid integer write size.",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVisitor.cpp"
               ,0x22);
  case 4:
    (*this->_vptr_VisitorImpl[0xc])();
    return;
  case 8:
    (*this->_vptr_VisitorImpl[0xd])(this,U,0);
    return;
  }
}

Assistant:

void DWARFYAML::VisitorImpl<T>::onVariableSizeValue(uint64_t U, unsigned Size) {
  switch (Size) {
  case 8:
    onValue((uint64_t)U);
    break;
  case 4:
    onValue((uint32_t)U);
    break;
  case 2:
    onValue((uint16_t)U);
    break;
  case 1:
    onValue((uint8_t)U);
    break;
  default:
    llvm_unreachable("Invalid integer write size.");
  }
}